

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP4Writer::DoPutDeferred
          (BP4Writer *this,Variable<std::complex<double>_> *variable,complex<double> *data)

{
  int iVar1;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  ScopedTimer __var2191;
  string local_78;
  string local_58;
  string local_38;
  
  if (DoPutDeferred(adios2::core::Variable<std::complex<double>>&,std::complex<double>const*)::
      __var191 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutDeferred(adios2::core::Variable<std::complex<double>>&,std::complex<double>const*)
                                 ::__var191);
    if (iVar1 != 0) {
      DoPutDeferred::__var191 = (void *)ps_timer_create_("BP4Writer::Put");
      __cxa_guard_release(&DoPutDeferred(adios2::core::Variable<std::complex<double>>&,std::complex<double>const*)
                           ::__var191);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2191,DoPutDeferred::__var191);
  std::__cxx11::string::string((string *)&local_38,"Engine",&local_81);
  std::__cxx11::string::string((string *)&local_58,"BP4Writer",&local_82);
  std::__cxx11::string::string((string *)&local_78,"PutDeferred",&local_83);
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_38,&local_58,&local_78,&(variable->super_VariableBase).m_Name,0,iVar1,5,
              this->m_Verbosity,INFO);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  PutDeferredCommon<std::complex<double>>(this,variable,data);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2191);
  return;
}

Assistant:

void BP4Writer::InitParameters()
{
    m_BP4Serializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    m_BP4Serializer.ResizeBuffer(m_BP4Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP4::Open to write");
    m_WriteToBB = !(m_BP4Serializer.m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_BP4Serializer.m_Parameters.BurstBufferDrain;
}